

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_mthd.h
# Opt level: O0

void __thiscall hwtest::pgraph::MthdClipRect::~MthdClipRect(MthdClipRect *this)

{
  MthdClipRect *this_local;
  
  ~MthdClipRect(this);
  operator_delete(this);
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (!(rnd() & 3)) {
			val &= ~0xffff;
		}
		if (!(rnd() & 3)) {
			val &= ~0xffff0000;
		}
		if (rnd() & 1) {
			val ^= 1 << (rnd() & 0x1f);
		}
	}